

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

Time __thiscall helics::FederateState::getTimeProperty(FederateState *this,int timeProperty)

{
  ulong uVar1;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  baseType local_8;
  
  uVar1 = (ulong)(in_ESI - 0x8f);
  switch(uVar1) {
  case 0:
  case 2:
    local_8 = *(baseType *)(in_RDI + 0x2d8);
    break;
  case 1:
    local_8 = *(baseType *)(in_RDI + 0x2e0);
    break;
  default:
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x4f55a3);
    local_8 = (baseType)
              TimeCoordinator::getTimeProperty
                        ((TimeCoordinator *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (int)(uVar1 >> 0x20));
    break;
  case 0x12:
    local_8 = *(baseType *)(in_RDI + 0x2e8);
  }
  return (Time)local_8;
}

Assistant:

Time FederateState::getTimeProperty(int timeProperty) const
{
    switch (timeProperty) {
        case defs::Properties::RT_LAG:
        case defs::Properties::RT_TOLERANCE:
            return rt_lag;
        case defs::Properties::RT_LEAD:
            return rt_lead;
        case defs::Properties::GRANT_TIMEOUT:
            return grantTimeOutPeriod;
        default:
            return timeCoord->getTimeProperty(timeProperty);
    }
}